

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  pointer paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  handle hVar4;
  _Bit_pointer puVar5;
  pointer pfVar6;
  PyTypeObject **ppPVar7;
  uint uVar8;
  uint uVar9;
  function_record *pfVar10;
  long lVar11;
  type_info *ptVar12;
  long *plVar13;
  PyTypeObject *pPVar14;
  _Bit_type *p_Var15;
  object *poVar16;
  PyObject *pPVar17;
  runtime_error *this;
  error_already_set *this_00;
  byte bVar18;
  PyTypeObject *pPVar19;
  size_type *psVar20;
  ulong uVar21;
  uint __uval;
  uint __val;
  _Bit_type *p_Var22;
  uint __len;
  int iVar23;
  size_type __new_size;
  handle hVar24;
  size_t size;
  ulong uVar25;
  long lVar26;
  size_t index;
  function_call *pfVar27;
  ulong uVar28;
  PyTypeObject *pPVar29;
  bool bVar30;
  handle value;
  dict kwargs;
  string msg;
  tuple extra_args;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  undefined1 local_1a8 [32];
  _Bit_pointer local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  _Bit_pointer local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  function_record *local_130;
  PyTypeObject *local_128;
  allocator<char> local_11a;
  allocator<char> local_119;
  undefined1 local_118 [8];
  undefined1 local_110 [16];
  handle *local_100;
  undefined1 auStack_f8 [16];
  _Bit_type *local_e8;
  handle hStack_e0;
  _Bit_pointer local_d8;
  handle local_d0;
  ulong local_c8;
  handle local_c0;
  long local_b8;
  PyObject local_b0;
  PyTypeObject *local_98;
  PyTypeObject *local_90;
  function_record *local_88;
  ulong local_80;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_> local_78
  ;
  PyObject *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  PyTypeObject **local_38;
  
  pfVar10 = (function_record *)PyCapsule_GetPointer(self,0);
  local_130 = pfVar10;
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                  ,0x189,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar28 = args_in[1].ob_refcnt;
  if (uVar28 == 0) {
    local_90 = (PyTypeObject *)0x0;
  }
  else {
    local_90 = args_in[1].ob_type;
  }
  local_78.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_start = (function_call *)0x0;
  local_78.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_finish = (function_call *)0x0;
  local_78.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (PyTypeObject *)args_in;
  if (pfVar10 != (function_record *)0x0) {
    local_88 = pfVar10->next;
    local_38 = &args_in[1].ob_type;
    hVar24.m_ptr = (PyObject *)0x1;
    local_128 = (PyTypeObject *)kwargs_in;
    local_80 = uVar28;
    do {
      bVar18 = (pfVar10->field_0x59 & 8) >> 3;
      uVar25 = (long)((char)(pfVar10->field_0x59 << 3) >> 7) +
               ((ulong)pfVar10->nargs - (ulong)bVar18);
      if (((bVar18 != 0) || (uVar28 <= uVar25)) &&
         ((uVar25 <= uVar28 ||
          (uVar25 <= (ulong)((long)(pfVar10->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pfVar10->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5))))) {
        local_e8 = (_Bit_type *)0x0;
        hStack_e0.m_ptr = hStack_e0.m_ptr & 0xffffffff00000000;
        local_d8 = (_Bit_pointer)0x0;
        auStack_f8._8_8_ = auStack_f8._8_8_ & 0xffffffff00000000;
        local_100 = (handle *)0x0;
        auStack_f8._0_8_ = (PyTypeObject *)0x0;
        local_110._0_8_ = (pointer)0x0;
        local_110._8_8_ = (handle *)0x0;
        local_d0.m_ptr = (PyObject *)local_90;
        local_118 = (undefined1  [8])pfVar10;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)local_110,
                   (ulong)pfVar10->nargs);
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)auStack_f8,(ulong)pfVar10->nargs);
        uVar21 = uVar25;
        if (uVar28 < uVar25) {
          uVar21 = uVar28;
        }
        local_c8 = uVar25;
        if (uVar21 != 0) {
          lVar26 = 0;
          uVar28 = 0;
          do {
            if ((((local_128 != (PyTypeObject *)0x0) &&
                 (paVar1 = (pfVar10->args).
                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                 uVar28 < (ulong)((long)(pfVar10->args).
                                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >>
                                 5))) && (*(long *)((long)&paVar1->name + lVar26) != 0)) &&
               (lVar11 = PyDict_GetItemString(local_128), lVar11 != 0)) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c0,pfVar10->name,&local_119);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_c0);
              local_150._M_dataplus._M_p = (pointer)*plVar13;
              psVar20 = (size_type *)(plVar13 + 2);
              if ((size_type *)local_150._M_dataplus._M_p == psVar20) {
                local_150.field_2._M_allocated_capacity = *psVar20;
                local_150.field_2._8_8_ = plVar13[3];
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              }
              else {
                local_150.field_2._M_allocated_capacity = *psVar20;
              }
              local_150._M_string_length = plVar13[1];
              *plVar13 = (long)psVar20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_58,
                         *(char **)((long)&((pfVar10->args).
                                            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->name +
                                   lVar26),&local_11a);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_178,&local_150,&local_58);
              plVar13 = (long *)std::__cxx11::string::append(local_178);
              local_1a8._0_8_ = *plVar13;
              pPVar17 = (PyObject *)(plVar13 + 2);
              if ((PyObject *)local_1a8._0_8_ == pPVar17) {
                local_1a8._16_8_ = pPVar17->ob_refcnt;
                local_1a8._24_8_ = plVar13[3];
                local_1a8._0_8_ = (PyObject *)(local_1a8 + 0x10);
              }
              else {
                local_1a8._16_8_ = pPVar17->ob_refcnt;
              }
              local_1a8._8_8_ = plVar13[1];
              *plVar13 = (long)pPVar17;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              std::runtime_error::runtime_error(this,(string *)local_1a8);
              *(undefined ***)this = &PTR__runtime_error_0012eb38;
              __cxa_throw(this,&type_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if (((*(PyTypeObject **)((long)&((PyTypeObject *)args_in)->ob_base + 8))->tp_flags &
                0x4000000) == 0) {
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                            ,0x1ca,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1a8._0_8_ = (&((PyTypeObject *)args_in)->tp_name)[uVar28];
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
            emplace_back<pybind11::handle>
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)local_110,
                       (handle *)local_1a8);
            paVar1 = (pfVar10->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar18 = 1;
            if (uVar28 < (ulong)((long)(pfVar10->args).
                                       super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >>
                                5)) {
              bVar18 = (&paVar1->field_0x18)[lVar26];
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_f8,(bool)(bVar18 & 1));
            uVar28 = uVar28 + 1;
            lVar26 = lVar26 + 0x20;
          } while (uVar21 != uVar28);
        }
        local_150._M_dataplus._M_p = (pointer)local_128;
        if (local_128 != (PyTypeObject *)0x0) {
          (local_128->ob_base).ob_base.ob_refcnt = (local_128->ob_base).ob_base.ob_refcnt + 1;
        }
        uVar28 = uVar21;
        if (local_80 < local_c8) {
          lVar26 = uVar21 << 5;
          bVar30 = false;
          local_60 = hVar24.m_ptr;
          do {
            paVar1 = (pfVar10->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1a8._0_8_ = (PyTypeObject *)0x0;
            if (((local_128 == (PyTypeObject *)0x0) ||
                (*(long *)((long)&paVar1->name + lVar26) == 0)) ||
               (local_1a8._0_8_ = PyDict_GetItemString(local_150._M_dataplus._M_p),
               (PyTypeObject *)local_1a8._0_8_ == (PyTypeObject *)0x0)) {
              pPVar14 = *(PyTypeObject **)((long)&(paVar1->value).m_ptr + lVar26);
              pPVar19 = (PyTypeObject *)local_1a8._0_8_;
              args_in = (PyObject *)local_98;
              hVar24.m_ptr = local_60;
            }
            else {
              if (!bVar30) {
                local_178._0_8_ = PyDict_Copy(local_150._M_dataplus._M_p);
                object::operator=((object *)&local_150,(object *)local_178);
                object::~object((object *)local_178);
              }
              PyDict_DelItemString
                        (local_150._M_dataplus._M_p,*(undefined8 *)((long)&paVar1->name + lVar26));
              bVar30 = true;
              pPVar14 = (PyTypeObject *)local_1a8._0_8_;
              pPVar19 = (PyTypeObject *)local_1a8._0_8_;
              args_in = (PyObject *)local_98;
              hVar24.m_ptr = local_60;
            }
            local_1a8._0_8_ = pPVar14;
            local_98 = (PyTypeObject *)args_in;
            local_60 = hVar24.m_ptr;
            if ((PyObject *)local_1a8._0_8_ == (PyObject *)0x0) {
              bVar30 = false;
              local_1a8._0_8_ = pPVar19;
              goto LAB_0011f2ca;
            }
            if ((handle *)local_110._8_8_ == local_100) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_110,
                         (iterator)local_110._8_8_,(handle *)local_1a8);
            }
            else {
              ((handle *)local_110._8_8_)->m_ptr = (PyObject *)local_1a8._0_8_;
              local_110._8_8_ = local_110._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_f8,
                       (bool)((&paVar1->field_0x18)[lVar26] & 1));
            uVar28 = uVar28 + 1;
            lVar26 = lVar26 + 0x20;
            args_in = (PyObject *)local_98;
            hVar24.m_ptr = local_60;
          } while (uVar28 < local_c8);
        }
        if ((((PyTypeObject *)local_150._M_dataplus._M_p == (PyTypeObject *)0x0) ||
            (lVar26 = PyDict_Size(), lVar26 == 0)) || ((pfVar10->field_0x59 & 0x10) != 0)) {
          tuple::tuple((tuple *)&local_c0,0);
          bVar18 = pfVar10->field_0x59;
          if ((bVar18 & 8) != 0) {
            if (uVar21 == 0) {
              (((PyTypeObject *)args_in)->ob_base).ob_base.ob_refcnt =
                   (((PyTypeObject *)args_in)->ob_base).ob_base.ob_refcnt + 1;
              local_1a8._0_8_ = args_in;
LAB_0011f002:
              object::operator=((object *)&local_c0,(object *)local_1a8);
              object::~object((object *)local_1a8);
            }
            else {
              size = local_80 - uVar28;
              if (local_80 < uVar28 || size == 0) {
                tuple::tuple((tuple *)local_1a8,0);
                goto LAB_0011f002;
              }
              tuple::tuple((tuple *)local_1a8,size);
              object::operator=((object *)&local_c0,(object *)local_1a8);
              object::~object((object *)local_1a8);
              ppPVar7 = local_38;
              index = 0;
              do {
                if (((*(PyTypeObject **)((long)&((PyTypeObject *)args_in)->ob_base + 8))->tp_flags &
                    0x4000000) == 0) {
                  __assert_fail("PyTuple_Check(args_in)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                                ,0x204,
                                "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                               );
                }
                hVar24.m_ptr = (PyObject *)ppPVar7[uVar28 + index];
                if (hVar24.m_ptr != (PyObject *)0x0) {
                  (hVar24.m_ptr)->ob_refcnt = (hVar24.m_ptr)->ob_refcnt + 1;
                }
                local_1a8._8_8_ = local_c0.m_ptr;
                local_1a8._24_8_ = 0;
                local_1a8._16_8_ = index;
                detail::accessor_policies::tuple_item::set(local_c0,index,hVar24);
                object::~object((object *)(local_1a8 + 0x18));
                index = index + 1;
              } while (size != index);
            }
            if ((handle *)local_110._8_8_ == local_100) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_110,
                         (iterator)local_110._8_8_,&local_c0);
            }
            else {
              *(PyObject **)local_110._8_8_ = local_c0.m_ptr;
              local_110._8_8_ = local_110._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_f8,false);
            bVar18 = pfVar10->field_0x59;
          }
          uVar28 = local_c8;
          if ((bVar18 & 0x10) != 0) {
            if ((PyTypeObject *)local_150._M_dataplus._M_p == (PyTypeObject *)0x0) {
              dict::dict((dict *)local_1a8);
              object::operator=((object *)&local_150,(object *)local_1a8);
              object::~object((object *)local_1a8);
            }
            if ((handle *)local_110._8_8_ == local_100) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_110,
                         (iterator)local_110._8_8_,(handle *)&local_150);
            }
            else {
              *(PyObject **)local_110._8_8_ = (PyObject *)local_150._M_dataplus._M_p;
              local_110._8_8_ = local_110._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_f8,false);
          }
          __new_size = (long)(local_110._8_8_ - local_110._0_8_) >> 3;
          if ((__new_size != pfVar10->nargs) ||
             (((ulong)hStack_e0.m_ptr & 0xffffffff) + ((long)local_e8 - auStack_f8._0_8_) * 8 !=
              __new_size)) {
            pybind11_fail(
                         "Internal error: function call dispatcher inserted wrong number of arguments!"
                         );
          }
          local_178._0_8_ = (PyObject *)0x0;
          local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
          local_168._0_8_ = (_Bit_type *)0x0;
          local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
          local_158 = (_Bit_pointer)0x0;
          if (local_88 != (function_record *)0x0) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)local_178,__new_size,false);
            puVar5 = local_d8;
            hVar24.m_ptr = hStack_e0.m_ptr;
            p_Var22 = local_e8;
            uVar3 = auStack_f8._8_8_;
            uVar2 = auStack_f8._0_8_;
            local_188 = local_d8;
            local_1a8._16_8_ = local_e8;
            local_1a8._24_8_ = hStack_e0.m_ptr;
            local_1a8._0_8_ = auStack_f8._0_8_;
            local_1a8._8_8_ = auStack_f8._8_8_;
            local_d8 = local_158;
            local_e8 = (_Bit_type *)local_168._0_8_;
            hStack_e0.m_ptr = (PyObject *)local_168._8_8_;
            auStack_f8._0_8_ = local_178._0_8_;
            auStack_f8._8_8_ = local_178._8_8_;
            local_158 = puVar5;
            local_168._0_8_ = p_Var22;
            local_168._8_8_ = hVar24.m_ptr;
            local_178._0_8_ = uVar2;
            local_178._8_8_ = uVar3;
          }
          hVar24 = (*pfVar10->impl)((function_call *)local_118);
          puVar5 = local_d8;
          hVar4.m_ptr = hStack_e0.m_ptr;
          p_Var22 = local_e8;
          uVar3 = auStack_f8._8_8_;
          uVar2 = auStack_f8._0_8_;
          bVar30 = hVar24.m_ptr != (PyObject *)0x1;
          if (!bVar30 && local_88 != (function_record *)0x0) {
            for (uVar25 = (ulong)((byte)pfVar10->field_0x59 >> 5 & 1); bVar30 = false,
                uVar25 < uVar28; uVar25 = uVar25 + 1) {
              uVar21 = uVar25 + 0x3f;
              if (-1 < (long)uVar25) {
                uVar21 = uVar25;
              }
              if ((*(ulong *)(local_178._0_8_ +
                             (ulong)((uVar25 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                             ((long)uVar21 >> 6) * 8 + -8) >> (uVar25 & 0x3f) & 1) != 0) {
                local_188 = local_d8;
                local_1a8._16_8_ = local_e8;
                local_1a8._24_8_ = hStack_e0.m_ptr;
                local_1a8._0_8_ = auStack_f8._0_8_;
                local_1a8._8_8_ = auStack_f8._8_8_;
                local_d8 = local_158;
                local_e8 = (_Bit_type *)local_168._0_8_;
                hStack_e0.m_ptr = (PyObject *)local_168._8_8_;
                auStack_f8._0_8_ = local_178._0_8_;
                auStack_f8._8_8_ = local_178._8_8_;
                local_158 = puVar5;
                local_168._0_8_ = p_Var22;
                local_168._8_8_ = hVar4.m_ptr;
                local_178._0_8_ = uVar2;
                local_178._8_8_ = uVar3;
                std::
                vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                ::emplace_back<pybind11::detail::function_call>
                          (&local_78,(function_call *)local_118);
                bVar30 = false;
                break;
              }
            }
          }
          if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)0x0) {
            operator_delete((void *)local_178._0_8_,(long)local_158 - local_178._0_8_);
          }
          object::~object((object *)&local_c0);
        }
        else {
          bVar30 = false;
        }
LAB_0011f2ca:
        object::~object((object *)&local_150);
        if ((PyTypeObject *)auStack_f8._0_8_ != (PyTypeObject *)0x0) {
          operator_delete((void *)auStack_f8._0_8_,(long)local_d8 - auStack_f8._0_8_);
          auStack_f8._0_8_ = (PyTypeObject *)0x0;
          auStack_f8._8_8_ = auStack_f8._8_8_ & 0xffffffff00000000;
          local_e8 = (_Bit_type *)0x0;
          hStack_e0.m_ptr = hStack_e0.m_ptr & 0xffffffff00000000;
          local_d8 = (_Bit_pointer)0x0;
        }
        if ((pointer)local_110._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
        }
        uVar28 = local_80;
        if (bVar30) break;
      }
      pfVar10 = pfVar10->next;
    } while (pfVar10 != (function_record *)0x0);
    pfVar6 = local_78.
             super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((local_88 == (function_record *)0x0) ||
       (local_78.
        super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_78.
        super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector(&local_78);
      if (hVar24.m_ptr == (PyObject *)0x1) goto LAB_0011f446;
    }
    else {
      pfVar27 = local_78.
                super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (hVar24.m_ptr == (PyObject *)0x1) {
        do {
          hVar24 = (*pfVar27->func->impl)(pfVar27);
          if (hVar24.m_ptr != (PyObject *)0x1) goto LAB_0011f3df;
          pfVar27 = pfVar27 + 1;
        } while (pfVar27 != pfVar6);
        goto LAB_0011f3ee;
      }
LAB_0011f3df:
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector(&local_78);
    }
    pPVar19 = local_90;
    if (hVar24.m_ptr != (PyObject *)0x0) {
      if ((local_130->field_0x59 & 1) != 0) {
        ptVar12 = detail::get_type_info((local_90->ob_base).ob_base.ob_type);
        (*ptVar12->init_holder)((PyObject *)pPVar19,(void *)0x0);
        return hVar24.m_ptr;
      }
      return hVar24.m_ptr;
    }
    local_118 = (undefined1  [8])(local_110 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_118);
    PyErr_SetString(_PyExc_TypeError,local_118);
    if (local_118 == (undefined1  [8])(local_110 + 8)) {
      return (PyObject *)0x0;
    }
    goto LAB_0011fb78;
  }
LAB_0011f3ee:
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector(&local_78);
LAB_0011f446:
  if ((local_130->field_0x59 & 4) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,local_130->name,(allocator<char> *)&local_58);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_150);
  pPVar19 = (PyTypeObject *)(plVar13 + 2);
  if ((PyTypeObject *)*plVar13 == pPVar19) {
    local_168._0_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
    local_168._8_8_ = plVar13[3];
    local_178._0_8_ = (PyObject *)local_168;
  }
  else {
    local_168._0_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
    local_178._0_8_ = (PyObject *)*plVar13;
  }
  local_178._8_8_ = plVar13[1];
  *plVar13 = (long)pPVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  iVar23 = 0x126cc3;
  if ((local_130->field_0x59 & 1) != 0) {
    iVar23 = 0x126cb7;
  }
  local_c0.m_ptr = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,iVar23,iVar23 + ((byte)local_130->field_0x59 & 1) * 3 + 8);
  p_Var22 = (_Bit_type *)((long)&((PyVarObject *)local_178._8_8_)->ob_base + local_b8);
  p_Var15 = (_Bit_type *)0xf;
  if ((PyObject *)local_178._0_8_ != (PyObject *)local_168) {
    p_Var15 = (_Bit_type *)local_168._0_8_;
  }
  if (p_Var15 < p_Var22) {
    p_Var15 = (_Bit_type *)0xf;
    if (local_c0.m_ptr != &local_b0) {
      p_Var15 = (_Bit_type *)local_b0.ob_refcnt;
    }
    if (p_Var15 < p_Var22) goto LAB_0011f5c3;
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,local_178._0_8_);
  }
  else {
LAB_0011f5c3:
    plVar13 = (long *)std::__cxx11::string::_M_append(local_178,(ulong)local_c0.m_ptr);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pPVar19 = (PyTypeObject *)(plVar13 + 2);
  if ((PyTypeObject *)*plVar13 == pPVar19) {
    local_1a8._16_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
    local_1a8._24_8_ = plVar13[3];
  }
  else {
    local_1a8._16_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
    local_1a8._0_8_ = (PyTypeObject *)*plVar13;
  }
  local_1a8._8_8_ = plVar13[1];
  *plVar13 = (long)pPVar19;
  plVar13[1] = 0;
  *(undefined1 *)&(pPVar19->ob_base).ob_base = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_1a8);
  local_118 = (undefined1  [8])(local_110 + 8);
  pfVar10 = (function_record *)(plVar13 + 2);
  if ((function_record *)*plVar13 == pfVar10) {
    local_110._8_8_ = pfVar10->name;
    local_100 = (handle *)plVar13[3];
  }
  else {
    local_110._8_8_ = pfVar10->name;
    local_118 = (undefined1  [8])*plVar13;
  }
  local_110._0_8_ = plVar13[1];
  *plVar13 = (long)pfVar10;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((PyTypeObject *)local_1a8._0_8_ != (PyTypeObject *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_c0.m_ptr != &local_b0) {
    operator_delete(local_c0.m_ptr,local_b0.ob_refcnt + 1);
  }
  if ((PyObject *)local_178._0_8_ != (PyObject *)local_168) {
    operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  pPVar19 = (PyTypeObject *)0x0;
  pfVar10 = local_130;
  do {
    __val = (uint)pPVar19 + 1;
    pPVar14 = (PyTypeObject *)(ulong)__val;
    __len = 1;
    if (8 < (uint)pPVar19) {
      pPVar19 = pPVar14;
      uVar8 = 4;
      do {
        __len = uVar8;
        uVar9 = (uint)pPVar19;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0011f756;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0011f756;
        }
        if (uVar9 < 10000) goto LAB_0011f756;
        pPVar19 = (PyTypeObject *)((ulong)pPVar19 / 10000);
        uVar8 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0011f756:
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_150,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_150._M_dataplus._M_p,__len,__val);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x126d05);
    pPVar19 = (PyTypeObject *)(plVar13 + 2);
    if ((PyTypeObject *)*plVar13 == pPVar19) {
      local_168._0_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
      local_168._8_8_ = plVar13[3];
      local_178._0_8_ = (PyObject *)local_168;
    }
    else {
      local_168._0_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
      local_178._0_8_ = (PyObject *)*plVar13;
    }
    local_178._8_8_ = plVar13[1];
    *plVar13 = (long)pPVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append(local_178);
    local_1a8._0_8_ = local_1a8 + 0x10;
    pPVar19 = (PyTypeObject *)(plVar13 + 2);
    if ((PyTypeObject *)*plVar13 == pPVar19) {
      local_1a8._16_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
      local_1a8._24_8_ = plVar13[3];
    }
    else {
      local_1a8._16_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
      local_1a8._0_8_ = (PyTypeObject *)*plVar13;
    }
    local_1a8._8_8_ = plVar13[1];
    *plVar13 = (long)pPVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_118,local_1a8._0_8_);
    if ((PyTypeObject *)local_1a8._0_8_ != (PyTypeObject *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((PyObject *)local_178._0_8_ != (PyObject *)local_168) {
      operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((local_130->field_0x59 & 1) == 0) {
LAB_0011f9ee:
      std::__cxx11::string::append((char *)local_118);
      pPVar19 = pPVar14;
    }
    else {
      local_128 = pPVar14;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pfVar10->signature,(allocator<char> *)local_178);
      lVar26 = std::__cxx11::string::find((char)local_1a8,0x28);
      pPVar19 = (PyTypeObject *)(lVar26 + 7);
      if ((ulong)local_1a8._8_8_ <= pPVar19) {
LAB_0011f9c1:
        pPVar14 = local_128;
        if ((PyTypeObject *)local_1a8._0_8_ != (PyTypeObject *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          pPVar14 = local_128;
        }
        goto LAB_0011f9ee;
      }
      pPVar14 = (PyTypeObject *)std::__cxx11::string::find(local_1a8,0x126d0a,0);
      local_c8 = std::__cxx11::string::rfind(local_1a8,0x126d0d,0xffffffffffffffff);
      if (pPVar14 < (ulong)local_1a8._8_8_) {
        pPVar29 = (PyTypeObject *)((long)&(pPVar14->ob_base).ob_base + 2);
      }
      else {
        pPVar14 = (PyTypeObject *)std::__cxx11::string::find((char)local_1a8,0x29);
        pPVar29 = pPVar14;
      }
      if ((pPVar14 <= pPVar19) || ((ulong)local_1a8._8_8_ <= pPVar29)) goto LAB_0011f9c1;
      std::__cxx11::string::append((string *)local_118,(ulong)local_1a8,(ulong)pPVar19);
      std::__cxx11::string::push_back((char)(string *)local_118);
      std::__cxx11::string::append((string *)local_118,(ulong)local_1a8,(ulong)pPVar29);
      pPVar19 = local_128;
      if ((PyTypeObject *)local_1a8._0_8_ != (PyTypeObject *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        pPVar19 = local_128;
      }
    }
    std::__cxx11::string::append((char *)local_118);
    pfVar10 = pfVar10->next;
  } while (pfVar10 != (function_record *)0x0);
  std::__cxx11::string::append(local_118);
  local_150._M_dataplus._M_p = (pointer)local_98;
  if (local_98 != (PyTypeObject *)0x0) {
    (local_98->ob_base).ob_base.ob_refcnt = (local_98->ob_base).ob_base.ob_refcnt + 1;
  }
  p_Var22 = (_Bit_type *)(ulong)((byte)local_130->field_0x59 & 1);
  while (p_Var15 = (_Bit_type *)PyTuple_Size(local_150._M_dataplus._M_p), p_Var22 < p_Var15) {
    local_178._8_8_ = local_150._M_dataplus._M_p;
    local_168._8_8_ = (PyObject *)0x0;
    local_168._0_8_ = p_Var22;
    poVar16 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_178);
    local_58._M_dataplus._M_p = (pointer)(poVar16->super_handle).m_ptr;
    if ((PyObject *)local_58._M_dataplus._M_p != (PyObject *)0x0) {
      ((PyObject *)local_58._M_dataplus._M_p)->ob_refcnt =
           ((PyObject *)local_58._M_dataplus._M_p)->ob_refcnt + 1;
    }
    pPVar17 = (PyObject *)PyObject_Repr(local_58._M_dataplus._M_p);
    if (pPVar17 == (PyObject *)0x0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_c0.m_ptr = pPVar17;
    str::operator_cast_to_string((string *)local_1a8,(str *)&local_c0);
    std::__cxx11::string::_M_append(local_118,local_1a8._0_8_);
    if ((PyTypeObject *)local_1a8._0_8_ != (PyTypeObject *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    object::~object((object *)&local_c0);
    object::~object((object *)&local_58);
    object::~object((object *)(local_168 + 8));
    lVar26 = PyTuple_Size(local_150._M_dataplus._M_p);
    p_Var22 = (_Bit_type *)((long)p_Var22 + 1);
    if (p_Var22 != (_Bit_type *)lVar26) {
      std::__cxx11::string::append(local_118);
    }
  }
  PyErr_SetString(_PyExc_TypeError,local_118);
  object::~object((object *)&local_150);
  if (local_118 == (undefined1  [8])(local_110 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0011fb78:
  operator_delete((void *)local_118,(ulong)((long)(PyObject **)local_110._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                for (; args_copied < args_to_copy; ++args_copied) {
                    // If we find a given positional argument that also has a named kwargs argument,
                    // raise a TypeError like Python does.  (We could also continue with the next
                    // overload, but this seems highly likely to be a caller mistake rather than a
                    // legitimate overload).
                    if (kwargs_in && args_copied < func.args.size() && func.args[args_copied].name) {
                        handle value = PyDict_GetItemString(kwargs_in, func.args[args_copied].name);
                        if (value)
                            throw type_error(std::string(func.name) + "(): got multiple values for argument '" +
                                    std::string(func.args[args_copied].name) + "'");
                    }

                    call.args.push_back(PyTuple_GET_ITEM(args_in, args_copied));
                    call.args_convert.push_back(args_copied < func.args.size() ? func.args[args_copied].convert : true);
                }

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                auto tinfo = get_type_info(Py_TYPE(parent.ptr()));
                tinfo->init_holder(parent.ptr(), nullptr);
            }
            return result.ptr();
        }
    }